

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_resource_manager.cpp
# Opt level: O2

bool __thiscall
CS248::GLResourceManager::createVertexShader
          (GLResourceManager *this,char *source_code,ShaderId *out_sid)

{
  bool bVar1;
  ostream *poVar2;
  
  bVar1 = anon_unknown_10::createShaderOfType(source_code,0x8b31,out_sid);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Above Errors are for vertex shader");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return bVar1;
}

Assistant:

bool GLResourceManager::createVertexShader(const char* source_code, ShaderId* out_sid) {
  bool success = createShaderOfType(source_code, GL_VERTEX_SHADER, out_sid);
  if (!success) {
    cerr << "Above Errors are for vertex shader" << endl;
  }
  return success;
}